

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qexception.cpp
# Opt level: O2

void __thiscall
QUnhandledException::QUnhandledException(QUnhandledException *this,exception_ptr exception)

{
  QUnhandledExceptionPrivate *this_00;
  long in_FS_OFFSET;
  undefined1 local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this->super_QException = (QException)&PTR__QUnhandledException_00668f68;
  this_00 = (QUnhandledExceptionPrivate *)operator_new(0x10);
  std::__exception_ptr::exception_ptr::exception_ptr
            ((exception_ptr *)local_30,(exception_ptr *)exception._M_exception_object);
  QUnhandledExceptionPrivate::QUnhandledExceptionPrivate(this_00,(exception_ptr)local_30);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type_conflict)
        (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QUnhandledException::QUnhandledException(std::exception_ptr exception) noexcept
    : d(new QUnhandledExceptionPrivate(exception))
{
}